

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int c14nCommonTest(char *filename,int with_comments,int mode,char *subdir)

{
  int iVar1;
  uint size;
  char *pcVar2;
  size_t sVar3;
  char *__ptr;
  char *filename_00;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  long *plVar12;
  undefined8 uVar13;
  ulong uVar14;
  char *pcVar15;
  xmlChar *result;
  char *nslist;
  int local_448;
  int local_444;
  long local_440;
  char *local_438;
  int local_42c;
  char buf [500];
  char prefix [500];
  
  local_448 = mode;
  local_444 = with_comments;
  pcVar2 = baseFilename(filename);
  sVar3 = strlen(pcVar2);
  sVar3 = (size_t)((int)sVar3 + -4);
  memcpy(prefix,pcVar2,sVar3);
  prefix[sVar3] = '\0';
  iVar1 = snprintf(buf,499,"result/c14n/%s/%s",subdir,prefix);
  if (0x1f2 < iVar1) {
    buf[499] = '\0';
  }
  pcVar2 = strdup(buf);
  iVar1 = snprintf(buf,499,"test/c14n/%s/%s.xpath",subdir,prefix);
  if (0x1f2 < iVar1) {
    buf[499] = '\0';
  }
  iVar1 = checkTestFile(buf);
  if (iVar1 == 0) {
    __ptr = (char *)0x0;
  }
  else {
    __ptr = strdup(buf);
  }
  iVar1 = snprintf(buf,499,"test/c14n/%s/%s.ns",subdir,prefix);
  if (0x1f2 < iVar1) {
    buf[499] = '\0';
  }
  iVar1 = checkTestFile(buf);
  if (iVar1 == 0) {
    filename_00 = (char *)0x0;
  }
  else {
    filename_00 = strdup(buf);
  }
  nb_tests = nb_tests + 1;
  result = (xmlChar *)0x0;
  nslist = (char *)0x0;
  puVar4 = (undefined4 *)__xmlLoadExtDtdDefaultValue();
  *puVar4 = 6;
  xmlSubstituteEntitiesDefault(1);
  lVar5 = xmlReadFile(filename,0,10);
  if (lVar5 == 0) {
    fprintf(_stderr,"Error: unable to parse file \"%s\"\n",filename);
  }
  else {
    lVar6 = xmlDocGetRootElement(lVar5);
    if (lVar6 == 0) {
      fprintf(_stderr,"Error: empty document for file \"%s\"\n",filename);
      goto LAB_0010c664;
    }
    local_438 = filename;
    if (__ptr != (char *)0x0) {
      puVar4 = (undefined4 *)__xmlLoadExtDtdDefaultValue();
      *puVar4 = 6;
      xmlSubstituteEntitiesDefault(1);
      lVar6 = xmlReadFile(__ptr,0,10);
      if (lVar6 == 0) {
        fprintf(_stderr,"Error: unable to parse file \"%s\"\n",__ptr);
      }
      else {
        lVar7 = xmlDocGetRootElement(lVar6);
        if (lVar7 == 0) {
          fprintf(_stderr,"Error: empty document for file \"%s\"\n",__ptr);
          xmlFreeDoc(lVar6);
        }
        else {
          plVar12 = (long *)(lVar6 + 0x18);
          while (lVar7 = *plVar12, lVar7 != 0) {
            iVar1 = xmlStrEqual(*(undefined8 *)(lVar7 + 0x10),"XPath");
            if (iVar1 != 0) {
              lVar8 = xmlNodeGetContent(lVar7);
              if (lVar8 == 0) {
                fprintf(_stderr,"Error: XPath content element is NULL \"%s\"\n",__ptr);
                xmlFreeDoc(lVar6);
                goto LAB_0010c648;
              }
              lVar9 = xmlXPathNewContext(lVar5);
              if (lVar9 == 0) {
                fwrite("Error: unable to create new context\n",0x24,1,_stderr);
                (*_xmlFree)(lVar8);
                goto LAB_0010c630;
              }
              plVar12 = (long *)(lVar7 + 0x60);
              goto LAB_0010c31d;
            }
            plVar12 = (long *)(lVar7 + 0x30);
          }
          fprintf(_stderr,"Error: XPath element expected in the file  \"%s\"\n",__ptr);
          xmlFreeDoc(lVar6);
        }
      }
      goto LAB_0010c648;
    }
    lVar7 = 0;
LAB_0010c3a1:
    if (filename_00 == (char *)0x0) {
      puVar11 = (undefined8 *)0x0;
    }
    else {
      iVar1 = loadMem(filename_00,&nslist,&local_42c);
      pcVar15 = nslist;
      if (iVar1 != 0) {
        fwrite("Error: unable to evaluate xpath expression\n",0x2b,1,_stderr);
        if (lVar7 != 0) {
          xmlXPathFreeObject(lVar7);
        }
        xmlFreeDoc(lVar5);
        goto LAB_0010c724;
      }
      if (nslist != (char *)0x0) {
        iVar1 = xmlStrlen(nslist);
        if ((*pcVar15 == '\'') && (pcVar15[(long)iVar1 + -1] == '\'')) {
          pcVar15[(long)iVar1 + -1] = '\0';
          pcVar15 = pcVar15 + 1;
        }
        puVar10 = (undefined8 *)(*_xmlMalloc)(8000);
        if (puVar10 != (undefined8 *)0x0) {
          iVar1 = 1000;
          puVar11 = puVar10;
          local_440 = lVar5;
LAB_0010c429:
          if (*pcVar15 != '\0') {
            uVar14 = (long)puVar10 - (long)puVar11;
            if ((long)(iVar1 + -10) < (long)uVar14 >> 3) {
              iVar1 = iVar1 * 2;
              puVar11 = (undefined8 *)(*_xmlRealloc)(puVar11,(long)iVar1 << 3);
              if (puVar11 == (undefined8 *)0x0) {
                perror("realloc failed");
                puVar11 = (undefined8 *)0x0;
                lVar5 = local_440;
                goto LAB_0010c684;
              }
              puVar10 = puVar11 + (int)(uVar14 >> 3);
            }
            *puVar10 = pcVar15;
            puVar10 = puVar10 + 1;
            for (; *pcVar15 != '\0'; pcVar15 = pcVar15 + 1) {
              if (*pcVar15 == ',') {
                *pcVar15 = '\0';
                pcVar15 = pcVar15 + 1;
                break;
              }
            }
            goto LAB_0010c429;
          }
          *puVar10 = 0;
          lVar5 = local_440;
          goto LAB_0010c684;
        }
        perror("malloc failed");
      }
      puVar11 = (undefined8 *)0x0;
    }
LAB_0010c684:
    if (lVar7 == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = *(undefined8 *)(lVar7 + 8);
    }
    size = xmlC14NDocDumpMemory(lVar5,uVar13,local_448,puVar11,local_444,&result);
    if ((int)size < 0) {
      fprintf(_stderr,"Error: failed to canonicalize XML file \"%s\" (ret=%d)\n",local_438,
              (ulong)size);
LAB_0010c7a8:
      size = 0xffffffff;
LAB_0010c6d5:
      if (result != (xmlChar *)0x0) {
        (*_xmlFree)();
      }
    }
    else if (result != (xmlChar *)0x0) {
      iVar1 = compareFileMem(pcVar2,(char *)result,size);
      if (iVar1 != 0) {
        fprintf(_stderr,"Result mismatch for %s\n",local_438);
        fprintf(_stderr,"RESULT:\n%s\n",result);
        goto LAB_0010c7a8;
      }
      goto LAB_0010c6d5;
    }
    if (lVar7 != 0) {
      xmlXPathFreeObject(lVar7);
    }
    if (puVar11 != (undefined8 *)0x0) {
      (*_xmlFree)(puVar11);
    }
    free(nslist);
    xmlFreeDoc(lVar5);
    iVar1 = 0;
    if (-1 < (int)size) goto LAB_0010c727;
  }
  goto LAB_0010c724;
  while (iVar1 = xmlXPathRegisterNs(lVar9,plVar12[3],plVar12[2]), iVar1 == 0) {
LAB_0010c31d:
    plVar12 = (long *)*plVar12;
    if (plVar12 == (long *)0x0) {
      lVar7 = xmlXPathEvalExpression(lVar8,lVar9);
      if (lVar7 == 0) {
        fwrite("Error: unable to evaluate xpath expression\n",0x2b,1,_stderr);
        goto LAB_0010c61c;
      }
      (*_xmlFree)(lVar8);
      xmlXPathFreeContext(lVar9);
      xmlFreeDoc(lVar6);
      goto LAB_0010c3a1;
    }
  }
  fprintf(_stderr,"Error: unable to register NS with prefix=\"%s\" and href=\"%s\"\n",plVar12[3],
          plVar12[2]);
LAB_0010c61c:
  (*_xmlFree)(lVar8);
  xmlXPathFreeContext(lVar9);
LAB_0010c630:
  xmlFreeDoc(lVar6);
LAB_0010c648:
  fwrite("Error: unable to evaluate xpath expression\n",0x2b,1,_stderr);
LAB_0010c664:
  xmlFreeDoc(lVar5);
LAB_0010c724:
  iVar1 = 1;
LAB_0010c727:
  free(pcVar2);
  free(__ptr);
  free(filename_00);
  return iVar1;
}

Assistant:

static int
c14nCommonTest(const char *filename, int with_comments, int mode,
               const char *subdir) {
    char buf[500];
    char prefix[500];
    const char *base;
    int len;
    char *result = NULL;
    char *xpath = NULL;
    char *ns = NULL;
    int ret = 0;

    base = baseFilename(filename);
    len = strlen(base);
    len -= 4;
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(buf, 499, "result/c14n/%s/%s", subdir, prefix) >= 499)
        buf[499] = 0;
    result = strdup(buf);
    if (snprintf(buf, 499, "test/c14n/%s/%s.xpath", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	xpath = strdup(buf);
    }
    if (snprintf(buf, 499, "test/c14n/%s/%s.ns", subdir, prefix) >= 499)
        buf[499] = 0;
    if (checkTestFile(buf)) {
	ns = strdup(buf);
    }

    nb_tests++;
    if (c14nRunTest(filename, with_comments, mode,
                    xpath, ns, result) < 0)
        ret = 1;

    if (result != NULL) free(result);
    if (xpath != NULL) free(xpath);
    if (ns != NULL) free(ns);
    return(ret);
}